

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_visitor<char>::visit_typed_array
          (basic_json_visitor<char> *this,span<const_double,_18446744073709551615UL> *s,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  basic_json_visitor<char> *this_00;
  basic_json_visitor<char> *pbVar1;
  span<const_double,_18446744073709551615UL> *in_RSI;
  double in_RDI;
  const_iterator p;
  ser_context *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  semantic_tag tag_00;
  basic_json_visitor<char> *in_stack_ffffffffffffffd0;
  basic_json_visitor<char> *this_01;
  
  tag_00 = (semantic_tag)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  detail::span<const_double,_18446744073709551615UL>::size(in_RSI);
  begin_array(in_stack_ffffffffffffffd0,(size_t)in_RDI,tag_00,in_stack_ffffffffffffffb8,
              (error_code *)0x19a780);
  this_00 = (basic_json_visitor<char> *)
            detail::span<const_double,_18446744073709551615UL>::begin(in_RSI);
  while( true ) {
    this_01 = this_00;
    pbVar1 = (basic_json_visitor<char> *)
             detail::span<const_double,_18446744073709551615UL>::end(in_RSI);
    if (this_00 == pbVar1) break;
    double_value(this_01,in_RDI,(semantic_tag)((ulong)this_00 >> 0x38),in_stack_ffffffffffffffb8,
                 (error_code *)0x19a7cf);
    this_00 = this_01 + 1;
  }
  end_array(this_00,in_stack_ffffffffffffffb8,(error_code *)0x19a7f3);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const double>& s, 
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec)  
        {
            begin_array(s.size(), tag,context, ec);
            for (auto p = s.begin(); p != s.end(); ++p)
            {
                double_value(*p,semantic_tag::none,context, ec);
            }
            end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }